

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O0

void ncnn::im2col_sgemm_pack1to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  Option *in_stack_00001608;
  Mat *in_stack_00001610;
  Mat *in_stack_00001618;
  Mat *in_stack_00001620;
  
  im2col_sgemm_pack1to4_int8_sse
            (in_stack_00001620,in_stack_00001618,in_stack_00001610,in_stack_00001608);
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}